

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_decals.cpp
# Opt level: O2

void DBaseDecal::SpreadLeft(double r,vertex_t *v1,side_t *feelwall,F3DFloor *ffloor)

{
  double dVar1;
  long lVar2;
  side_t *wall;
  ulong uVar3;
  double dVar4;
  double startr;
  vertex_t *v2;
  double ldy;
  double ldx;
  double local_80;
  side_t *local_78;
  double local_70;
  vertex_t *local_68;
  double local_60;
  double local_58;
  double local_50;
  vertex_t *local_48;
  double local_40;
  double local_38;
  
  local_78 = feelwall;
  local_68 = v1;
  TArray<side_t_*,_side_t_*>::Push(&SpreadStack,&local_78);
  local_80 = r;
  do {
    do {
      local_70 = local_80;
      if ((0.0 <= local_80) || ((ulong)local_78->LeftSide == 0xffffffff)) {
        return;
      }
      local_50 = (local_68->p).X;
      dVar1 = (local_68->p).Y;
      local_78 = sides + local_78->LeftSide;
      GetWallStuff(local_78,&local_68,&local_38,&local_40);
      local_60 = local_38;
      local_58 = local_40;
      dVar4 = Length(local_38,local_40);
      local_80 = dVar4 + local_70;
      (*(SpreadSource->super_DThinker).super_DObject._vptr_DObject[10])
                ((local_60 * (DecalLeft + local_70)) / dVar4 + local_50,
                 ((DecalLeft + local_70) * local_58) / dVar4 + dVar1,SpreadZ,SpreadSource,
                 SpreadTemplate,local_78,ffloor);
      TArray<side_t_*,_side_t_*>::Push(&SpreadStack,&local_78);
      wall = NextWall(local_78);
    } while ((wall == (side_t *)0x0) || (wall->LeftSide == 0xffffffff));
    uVar3 = (ulong)SpreadStack.Count;
    do {
      if ((int)uVar3 < 1) {
        if (uVar3 == 0) {
          GetWallStuff(wall,&local_48,&local_38,&local_40);
          SpreadLeft(local_70,local_48,wall,ffloor);
        }
        break;
      }
      lVar2 = uVar3 - 1;
      uVar3 = uVar3 - 1;
    } while (SpreadStack.Array[lVar2] != wall);
  } while( true );
}

Assistant:

void DBaseDecal::SpreadLeft (double r, vertex_t *v1, side_t *feelwall, F3DFloor *ffloor)
{
	double ldx, ldy;

	SpreadStack.Push (feelwall);

	while (r < 0 && feelwall->LeftSide != NO_SIDE)
	{
		double startr = r;

		double x = v1->fX();
		double y = v1->fY();

		feelwall = &sides[feelwall->LeftSide];
		GetWallStuff (feelwall, v1, ldx, ldy);
		double wallsize = Length (ldx, ldy);
		r += DecalLeft;
		x += r*ldx / wallsize;
		y += r*ldy / wallsize;
		r = wallsize + startr;
		SpreadSource->CloneSelf (SpreadTemplate, x, y, SpreadZ, feelwall, ffloor);
		SpreadStack.Push (feelwall);

		side_t *nextwall = NextWall (feelwall);
		if (nextwall != NULL && nextwall->LeftSide != NO_SIDE)
		{
			int i;

			for (i = SpreadStack.Size(); i-- > 0; )
			{
				if (SpreadStack[i] == nextwall)
					break;
			}
			if (i == -1)
			{
				vertex_t *v2;

				GetWallStuff (nextwall, v2, ldx, ldy);
				SpreadLeft (startr, v2, nextwall, ffloor);
			}
		}
	}
}